

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::expand
          (DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *pDVar4;
  undefined8 uVar5;
  Entry *pEVar6;
  uint *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffc0;
  DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  char *in_stack_ffffffffffffffd8;
  DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *__ptr;
  Exception *in_stack_ffffffffffffffe0;
  
  if (0x1c < (int)in_RDI[3]) {
    uVar5 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar5,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  uVar1 = *(uint *)(DHMapTableCapacities + (long)(int)(in_RDI[3] + 1) * 4);
  Lib::alloc(in_stack_ffffffffffffffb0);
  this_00 = *(DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> **)(in_RDI + 6);
  pDVar4 = *(DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> **)(in_RDI + 8);
  uVar2 = *in_RDI;
  uVar3 = in_RDI[4];
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = in_RDI[3] + 1;
  in_RDI[4] = uVar1;
  in_RDI[5] = *(uint *)(DHMapTableNextExpansions + (long)(int)in_RDI[3] * 4);
  pEVar6 = array_new<Lib::DHMap<unsigned_int,bool,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_stack_ffffffffffffffc0,(size_t)in_RDI);
  *(Entry **)(in_RDI + 6) = pEVar6;
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 6) + (long)(int)in_RDI[4] * 0xc;
  __ptr = this_00;
  for (; this_00 != pDVar4;
      this_00 = (DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                &this_00->_capacityIndex) {
    if ((this_00->_timestamp >> 2 == uVar2) && ((this_00->_timestamp & 1) == 0)) {
      insert(this_00,(uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    }
  }
  if (uVar3 != 0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }